

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_armor_upgrades.hpp
# Opt level: O0

uint32_t PatchArmorUpgrades::inject_function_alter_item_given_by_ground_source
                   (ROM *rom,uint32_t function_alter_item_in_d0)

{
  uint32_t uVar1;
  allocator<char> local_169;
  string local_168;
  AddressRegister local_148;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  DataRegister local_e8;
  allocator<char> local_d1;
  string local_d0;
  DataRegister local_a0;
  undefined1 local_90 [8];
  Code func;
  uint32_t function_alter_item_in_d0_local;
  ROM *rom_local;
  
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = function_alter_item_in_d0;
  md::Code::Code((Code *)local_90);
  md::DataRegister::DataRegister(&local_a0,'\0');
  md::Code::cmpib((Code *)local_90,'\f',(Param *)&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"return",&local_d1);
  md::Code::bgt((Code *)local_90,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  md::DataRegister::DataRegister(&local_e8,'\0');
  md::Code::cmpib((Code *)local_90,'\t',(Param *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"return",&local_109);
  md::Code::blt((Code *)local_90,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  md::Code::jsr((Code *)local_90,func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
               );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"return",&local_131);
  md::Code::label((Code *)local_90,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  md::AddressRegister::AddressRegister(&local_148,'\0');
  md::Code::lea((Code *)local_90,0xff1040,&local_148);
  md::Code::rts((Code *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"",&local_169);
  uVar1 = md::ROM::inject_code(rom,(Code *)local_90,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  md::Code::~Code((Code *)local_90);
  return uVar1;
}

Assistant:

[[nodiscard]] static uint32_t inject_function_alter_item_given_by_ground_source(md::ROM& rom,
                                                                                    uint32_t function_alter_item_in_d0)
    {
        md::Code func;
        {
            func.cmpib(ITEM_HYPER_BREAST, reg_D0);
            func.bgt("return");
            func.cmpib(ITEM_STEEL_BREAST, reg_D0);
            func.blt("return");
            {
                func.jsr(function_alter_item_in_d0);
            }
        }
        func.label("return");
        func.lea(0xFF1040, reg_A0);
        func.rts();

        return rom.inject_code(func);
    }